

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O2

vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *
deqp::gls::checkAndSpecializeExtensions
          (vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
           *__return_storage_ptr__,
          vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *src,
          ContextInfo *ctxInfo)

{
  size_type sVar1;
  bool bVar2;
  NotSupportedError *this;
  ulong uVar3;
  pointer pRVar4;
  long lVar5;
  size_t alternativeNdx;
  ulong uVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream extensionList;
  
  (__return_storage_ptr__->
  super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0;
  while( true ) {
    pRVar4 = (src->
             super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(src->
                      super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 5) <= uVar3) {
      return __return_storage_ptr__;
    }
    pRVar4 = pRVar4 + uVar3;
    lVar5 = 0;
    uVar6 = 0;
    while( true ) {
      lVar7 = *(long *)&(pRVar4->alternatives).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl;
      if ((ulong)((long)*(pointer *)
                         ((long)&(pRVar4->alternatives).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl + 8) - lVar7 >> 5) <= uVar6) goto LAB_014c8f07;
      bVar2 = glu::ContextInfo::isExtensionSupported(ctxInfo,*(char **)(lVar7 + lVar5));
      if (bVar2) break;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x20;
    }
    if ((int)(uint)uVar6 < 0) break;
    glu::sl::RequiredExtension::RequiredExtension
              ((RequiredExtension *)&extensionList,
               (string *)
               ((ulong)((uint)uVar6 & 0x7fffffff) * 0x20 +
               *(long *)&(pRVar4->alternatives).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl),pRVar4->effectiveStages);
    std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
    emplace_back<glu::sl::RequiredExtension>
              (__return_storage_ptr__,(RequiredExtension *)&extensionList);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&extensionList);
    uVar3 = uVar3 + 1;
  }
LAB_014c8f07:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&extensionList);
  lVar5 = 0;
  for (uVar3 = 0;
      lVar7 = (long)*(pointer *)
                     ((long)&(pRVar4->alternatives).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl + 8) -
              *(long *)&(pRVar4->alternatives).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl, uVar3 < (ulong)(lVar7 >> 5); uVar3 = uVar3 + 1) {
    std::__cxx11::stringbuf::str();
    sVar1 = local_1e8._M_string_length;
    std::__cxx11::string::~string((string *)&local_1e8);
    if (sVar1 != 0) {
      std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,", ");
    }
    std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                    (string *)
                    (*(long *)&(pRVar4->alternatives).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl + lVar5));
    lVar5 = lVar5 + 0x20;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  if (lVar7 == 0x20) {
    std::__cxx11::stringbuf::str();
    std::operator+(&local_1e8,"Test requires extension ",&local_1c8);
    tcu::NotSupportedError::NotSupportedError(this,&local_1e8);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::stringbuf::str();
  std::operator+(&local_1e8,"Test requires any extension of ",&local_1c8);
  tcu::NotSupportedError::NotSupportedError(this,&local_1e8);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static vector<RequiredExtension> checkAndSpecializeExtensions (const vector<RequiredExtension>&	src,
															   const ContextInfo&				ctxInfo)
{
	vector<RequiredExtension>	specialized;

	for (size_t extNdx = 0; extNdx < src.size(); ++extNdx)
	{
		const RequiredExtension&	extension		= src[extNdx];
		int							supportedAltNdx	= -1;

		for (size_t alternativeNdx = 0; alternativeNdx < extension.alternatives.size(); ++alternativeNdx)
		{
			if (ctxInfo.isExtensionSupported(extension.alternatives[alternativeNdx].c_str()))
			{
				supportedAltNdx	= (int)alternativeNdx;
				break;
			}
		}

		if (supportedAltNdx >= 0)
		{
			specialized.push_back(RequiredExtension(extension.alternatives[supportedAltNdx], extension.effectiveStages));
		}
		else
		{
			// no extension(s). Make a nice output
			std::ostringstream extensionList;

			for (size_t ndx = 0; ndx < extension.alternatives.size(); ++ndx)
			{
				if (!extensionList.str().empty())
					extensionList << ", ";
				extensionList << extension.alternatives[ndx];
			}

			if (extension.alternatives.size() == 1)
				throw tcu::NotSupportedError("Test requires extension " + extensionList.str());
			else
				throw tcu::NotSupportedError("Test requires any extension of " + extensionList.str());
		}
	}

	return specialized;
}